

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O3

int snprintf_error_data(char *buf,size_t len,uint8_t err,char **arr,int arr_len)

{
  uint uVar1;
  undefined7 in_register_00000011;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar3 = 0;
  if (0 < arr_len && (len != 0 && (int)CONCAT71(in_register_00000011,err) != 0)) {
    uVar5 = 0;
    iVar2 = 0;
    iVar3 = 0;
    do {
      if ((err >> ((uint)uVar5 & 0x1f) & 1) != 0) {
        if (iVar2 != 0) {
          uVar4 = len - (long)iVar3;
          uVar1 = snprintf(buf + iVar3,uVar4,",");
          if ((int)uVar1 < 0) {
            return iVar3;
          }
          if (uVar4 <= uVar1) {
            return iVar3;
          }
          iVar3 = iVar3 + uVar1;
        }
        uVar4 = len - (long)iVar3;
        uVar1 = snprintf(buf + iVar3,uVar4,"%s",arr[uVar5]);
        if ((int)uVar1 < 0) {
          return iVar3;
        }
        if (uVar4 <= uVar1) {
          return iVar3;
        }
        iVar3 = iVar3 + uVar1;
        iVar2 = iVar2 + 1;
      }
      uVar5 = uVar5 + 1;
    } while ((uint)arr_len != uVar5);
  }
  return iVar3;
}

Assistant:

static int snprintf_error_data(char *buf, size_t len, uint8_t err,
			       const char **arr, int arr_len)
{
	int i, n = 0, count = 0;

	if (!err || len <= 0)
		return 0;

	for (i = 0; i < arr_len; i++) {
		if (err & (1 << i)) {
			int tmp_n = 0;
			if (count){
				/* Fix for potential buffer overflow https://lgtm.com/rules/1505913226124/ */
				tmp_n = snprintf(buf + n, len - n, ",");
				if (tmp_n < 0 || (size_t)tmp_n >= len - n){
					return n;
				}
				n += tmp_n;
			}
			tmp_n = snprintf(buf + n, len - n, "%s", arr[i]);
			if (tmp_n < 0 || (size_t)tmp_n >= len - n){
				return n;
			}
			n += tmp_n;
			count++;
		}
	}

	return n;
}